

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O3

void __thiscall ImGuiWS::~ImGuiWS(ImGuiWS *this)

{
  Incppect<false>::stop();
  if ((native_handle_type)
      (((this->m_impl)._M_t.
        super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
        super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
        super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->worker)._M_id != 0) {
    std::thread::join();
  }
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::~unique_ptr(&this->m_impl);
  return;
}

Assistant:

ImGuiWS::~ImGuiWS() {
    m_impl->incpp.stop();
    if (m_impl->worker.joinable()) {
        m_impl->worker.join();
    }
}